

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O2

TestStatus * __thiscall
vkt::shaderexecutor::
BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<tcu::Vector<float,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<float,_vkt::shaderexecutor::Void>_>
::iterate(TestStatus *__return_storage_ptr__,
         BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<tcu::Vector<float,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<float,_vkt::shaderexecutor::Void>_>
         *this)

{
  StatementP *value;
  _Rb_tree_node_base *p_Var1;
  ostringstream *poVar2;
  ostream *poVar3;
  Precision PVar4;
  Samplings<vkt::shaderexecutor::InTypes<tcu::Vector<float,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  *this_00;
  Statement *pSVar5;
  ShaderExecutor *pSVar6;
  BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<tcu::Vector<float,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<float,_vkt::shaderexecutor::Void>_>
  *pBVar7;
  bool bVar8;
  int iVar9;
  MessageBuilder *this_01;
  _Rb_tree_node_base *p_Var10;
  size_t sVar11;
  IVal *pIVar12;
  IVal *x;
  Vector<float,_2> *value_00;
  TestStatus *__return_storage_ptr___00;
  FloatFormat *pFVar13;
  string *this_02;
  long lVar14;
  IVal reference1;
  int numErrors;
  IVal in3;
  FuncSet funcs;
  IVal in2;
  Environment env;
  void *outputArr [2];
  FloatFormat highpFmt;
  void *inputArr [4];
  Outputs<vkt::shaderexecutor::OutTypes<float,_vkt::shaderexecutor::Void>_> outputs;
  IVal in0;
  Inputs<vkt::shaderexecutor::InTypes<tcu::Vector<float,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  inputs;
  ResultCollector status;
  ostringstream oss;
  deUint32 in_stack_fffffffffffffaa8;
  IVal local_551;
  TestLog *local_550;
  BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<tcu::Vector<float,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<float,_vkt::shaderexecutor::Void>_>
  *local_548;
  uint local_53c;
  size_t local_538;
  ulong local_530;
  FloatFormat *local_528;
  size_t local_520;
  long local_518;
  TestStatus *local_510;
  TestLog *local_508;
  double dStack_500;
  double dStack_4f8;
  undefined1 local_4e8 [32];
  _Rb_tree_node_base *local_4c8;
  size_t local_4c0;
  string local_4b8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  local_498;
  Vector<float,_2> local_468;
  pointer local_460;
  FloatFormat local_458;
  pointer local_428;
  pointer local_420;
  pointer local_418;
  pointer local_410;
  Outputs<vkt::shaderexecutor::OutTypes<float,_vkt::shaderexecutor::Void>_> local_408;
  undefined1 local_3d8 [32];
  Vector<float,_2> *local_3b8;
  Precision PStack_3b0;
  undefined4 uStack_3ac;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  *local_3a8;
  undefined4 local_3a0;
  Inputs<vkt::shaderexecutor::InTypes<tcu::Vector<float,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  local_258;
  ResultCollector local_1f8;
  string local_1a8 [11];
  
  this_00 = this->m_samplings;
  pFVar13 = &(this->m_caseCtx).floatFormat;
  PVar4 = (this->m_caseCtx).precision;
  sVar11 = (this->m_caseCtx).numRandoms;
  local_510 = __return_storage_ptr__;
  iVar9 = tcu::CommandLine::getBaseSeed(((this->m_caseCtx).testContext)->m_cmdLine);
  local_528 = pFVar13;
  generateInputs<vkt::shaderexecutor::InTypes<tcu::Vector<float,2>,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void>>
            (&local_258,(shaderexecutor *)this_00,
             (Samplings<vkt::shaderexecutor::InTypes<tcu::Vector<float,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
              *)pFVar13,(FloatFormat *)(ulong)PVar4,(Precision)sVar11,(ulong)(iVar9 + 0xdeadbeef),
             in_stack_fffffffffffffaa8);
  local_538 = (long)local_258.in0.
                    super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_258.in0.
                    super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3;
  Outputs<vkt::shaderexecutor::OutTypes<float,_vkt::shaderexecutor::Void>_>::Outputs
            (&local_408,local_538);
  local_458.m_maxValue = (this->m_caseCtx).highpFormat.m_maxValue;
  local_458.m_minExp = (this->m_caseCtx).highpFormat.m_minExp;
  local_458.m_maxExp = (this->m_caseCtx).highpFormat.m_maxExp;
  local_458.m_fractionBits = (this->m_caseCtx).highpFormat.m_fractionBits;
  local_458.m_hasSubnormal = (this->m_caseCtx).highpFormat.m_hasSubnormal;
  local_458.m_hasInf = (this->m_caseCtx).highpFormat.m_hasInf;
  local_458.m_hasNaN = (this->m_caseCtx).highpFormat.m_hasNaN;
  local_458.m_exactPrecision = (this->m_caseCtx).highpFormat.m_exactPrecision;
  local_458._25_7_ = *(undefined7 *)&(this->m_caseCtx).highpFormat.field_0x19;
  local_53c = 0;
  local_498._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_498._M_impl.super__Rb_tree_header._M_header;
  local_498._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_498._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_498._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_498._M_impl.super__Rb_tree_header._M_header._M_right =
       local_498._M_impl.super__Rb_tree_header._M_header._M_left;
  tcu::ResultCollector::ResultCollector(&local_1f8);
  local_550 = ((this->super_TestInstance).m_context)->m_testCtx->m_log;
  local_428 = local_258.in0.
              super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
              _M_impl.super__Vector_impl_data._M_start;
  local_420 = local_258.in1.
              super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_418 = local_258.in2.
              super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_410 = local_258.in3.
              super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_468.m_data =
       (float  [2])
       local_408.out0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_460 = local_408.out1.
              super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
              ._M_impl.super__Vector_impl_data._M_start;
  poVar2 = (ostringstream *)(local_3d8 + 8);
  local_548 = this;
  local_3d8._0_8_ = local_550;
  std::__cxx11::ostringstream::ostringstream(poVar2);
  pFVar13 = local_528;
  std::operator<<((ostream *)poVar2,"Statement: ");
  value = &local_548->m_stmt;
  this_01 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_3d8,value);
  tcu::MessageBuilder::operator<<(this_01,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar2);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  p_Var1 = (_Rb_tree_node_base *)(local_4e8 + 8);
  local_4e8._8_4_ = _S_red;
  local_4e8._16_8_ = (_Base_ptr)0x0;
  local_4c0 = 0;
  pSVar5 = (value->super_SharedPtr<const_vkt::shaderexecutor::Statement>).m_ptr;
  local_4e8._24_8_ = p_Var1;
  local_4c8 = p_Var1;
  (*pSVar5->_vptr_Statement[4])(pSVar5,local_4e8);
  for (p_Var10 = (_Rb_tree_node_base *)local_4e8._24_8_; p_Var10 != p_Var1;
      p_Var10 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var10)) {
    (**(code **)(**(long **)(p_Var10 + 1) + 0x30))(*(long **)(p_Var10 + 1),local_1a8);
  }
  if (local_4c0 != 0) {
    poVar2 = (ostringstream *)(local_3d8 + 8);
    local_3d8._0_8_ = local_550;
    std::__cxx11::ostringstream::ostringstream(poVar2);
    std::operator<<((ostream *)poVar2,"Reference definitions:\n");
    std::__cxx11::stringbuf::str();
    std::operator<<((ostream *)poVar2,(string *)&local_4b8);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_3d8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::string::~string((string *)&local_4b8);
    std::__cxx11::ostringstream::~ostringstream(poVar2);
  }
  std::
  _Rb_tree<const_vkt::shaderexecutor::FuncBase_*,_const_vkt::shaderexecutor::FuncBase_*,_std::_Identity<const_vkt::shaderexecutor::FuncBase_*>,_std::less<const_vkt::shaderexecutor::FuncBase_*>,_std::allocator<const_vkt::shaderexecutor::FuncBase_*>_>
  ::~_Rb_tree((_Rb_tree<const_vkt::shaderexecutor::FuncBase_*,_const_vkt::shaderexecutor::FuncBase_*,_std::_Identity<const_vkt::shaderexecutor::FuncBase_*>,_std::less<const_vkt::shaderexecutor::FuncBase_*>,_std::allocator<const_vkt::shaderexecutor::FuncBase_*>_>
               *)local_4e8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  pBVar7 = local_548;
  pSVar6 = (local_548->m_executor).
           super_UniqueBase<vkt::shaderexecutor::ShaderExecutor,_de::DefaultDeleter<vkt::shaderexecutor::ShaderExecutor>_>
           .m_data.ptr;
  value_00 = &local_468;
  (*pSVar6->_vptr_ShaderExecutor[2])(pSVar6,local_538,&local_428,value_00,0);
  tcu::Vector<tcu::Interval,_2>::Vector((Vector<tcu::Interval,_2> *)local_3d8);
  local_1a8[0]._M_dataplus._M_p._0_1_ = 0;
  local_1a8[0]._M_string_length = 0x7ff0000000000000;
  local_1a8[0].field_2._M_allocated_capacity = 0xfff0000000000000;
  Environment::bind<tcu::Vector<float,2>>
            ((Environment *)&local_498,
             (pBVar7->m_variables).in0.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_2>_>_>.m_ptr,
             (IVal *)local_3d8);
  Environment::bind<vkt::shaderexecutor::Void>
            ((Environment *)&local_498,
             (pBVar7->m_variables).in1.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr,
             (IVal *)local_4e8);
  Environment::bind<vkt::shaderexecutor::Void>
            ((Environment *)&local_498,
             (pBVar7->m_variables).in2.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr,
             (IVal *)&local_4b8);
  Environment::bind<vkt::shaderexecutor::Void>
            ((Environment *)&local_498,
             (pBVar7->m_variables).in3.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr,
             (IVal *)&local_508);
  Environment::bind<float>
            ((Environment *)&local_498,
             (pBVar7->m_variables).out0.super_SharedPtr<const_vkt::shaderexecutor::Variable<float>_>
             .m_ptr,(IVal *)local_1a8);
  Environment::bind<vkt::shaderexecutor::Void>
            ((Environment *)&local_498,
             (pBVar7->m_variables).out1.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr,
             &local_551);
  lVar14 = 0;
  local_518 = 0;
  local_530 = 0;
  sVar11 = local_538;
  while (sVar11 != 0) {
    local_508 = (TestLog *)((ulong)local_508 & 0xffffffffffffff00);
    dStack_500 = INFINITY;
    dStack_4f8 = -INFINITY;
    local_520 = sVar11 - 1;
    round<tcu::Vector<float,2>>
              ((IVal *)local_1a8,(shaderexecutor *)pFVar13,
               (FloatFormat *)
               ((long)(local_258.in0.
                       super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar14),value_00);
    pBVar7 = local_548;
    ContainerTraits<tcu::Vector<float,_2>,_tcu::Vector<tcu::Interval,_2>_>::doConvert
              ((IVal *)local_3d8,pFVar13,(IVal *)local_1a8);
    pIVar12 = Environment::lookup<tcu::Vector<float,2>>
                        ((Environment *)&local_498,
                         (pBVar7->m_variables).in0.
                         super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_2>_>_>
                         .m_ptr);
    pIVar12->m_data[1].m_lo = (double)local_3b8;
    pIVar12->m_data[1].m_hi = (double)CONCAT44(uStack_3ac,PStack_3b0);
    pIVar12->m_data[0].m_hi = (double)CONCAT44(local_3d8._20_4_,local_3d8._16_4_);
    *(ulong *)(pIVar12->m_data + 1) = CONCAT44(local_3d8._28_4_,local_3d8._24_4_);
    *(undefined8 *)pIVar12->m_data = local_3d8._0_8_;
    pIVar12->m_data[0].m_lo = (double)CONCAT44(local_3d8._12_4_,local_3d8._8_4_);
    Environment::lookup<vkt::shaderexecutor::Void>
              ((Environment *)&local_498,
               (pBVar7->m_variables).in1.
               super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.
               m_ptr);
    Environment::lookup<vkt::shaderexecutor::Void>
              ((Environment *)&local_498,
               (pBVar7->m_variables).in2.
               super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.
               m_ptr);
    Environment::lookup<vkt::shaderexecutor::Void>
              ((Environment *)&local_498,
               (pBVar7->m_variables).in3.
               super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.
               m_ptr);
    PStack_3b0 = (pBVar7->m_caseCtx).precision;
    value_00 = (Vector<float,_2> *)pFVar13->m_maxValue;
    local_3d8._0_8_ = *(undefined8 *)pFVar13;
    local_3d8._8_4_ = pFVar13->m_fractionBits;
    local_3d8._12_4_ = pFVar13->m_hasSubnormal;
    local_3d8._16_4_ = pFVar13->m_hasInf;
    local_3d8._20_4_ = pFVar13->m_hasNaN;
    local_3d8[0x18] = pFVar13->m_exactPrecision;
    local_3d8._25_3_ = *(undefined3 *)&pFVar13->field_0x19;
    local_3d8._28_4_ = *(undefined4 *)&pFVar13->field_0x1c;
    local_3a0 = 0;
    pSVar5 = (pBVar7->m_stmt).super_SharedPtr<const_vkt::shaderexecutor::Statement>.m_ptr;
    local_3b8 = value_00;
    local_3a8 = &local_498;
    (*pSVar5->_vptr_Statement[3])(pSVar5,local_3d8);
    x = Environment::lookup<float>
                  ((Environment *)&local_498,
                   (pBVar7->m_variables).out0.
                   super_SharedPtr<const_vkt::shaderexecutor::Variable<float>_>.m_ptr);
    tcu::FloatFormat::convert((Interval *)local_3d8,&local_458,x);
    dStack_4f8 = (double)CONCAT44(local_3d8._20_4_,local_3d8._16_4_);
    dStack_500 = (double)CONCAT44(local_3d8._12_4_,local_3d8._8_4_);
    local_508 = (TestLog *)local_3d8._0_8_;
    bVar8 = contains<float>((IVal *)&local_508,
                            (float *)((long)local_408.out0.
                                            super__Vector_base<float,_std::allocator<float>_>.
                                            _M_impl.super__Vector_impl_data._M_start + local_518));
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_3d8,"Shader output 0 is outside acceptable range",
               (allocator<char> *)local_1a8);
    bVar8 = tcu::ResultCollector::check(&local_1f8,bVar8,(string *)local_3d8);
    std::__cxx11::string::~string((string *)local_3d8);
    pFVar13 = local_528;
    if (!bVar8) {
      local_53c = (int)local_530 + 1;
      local_530 = (ulong)local_53c;
      if ((int)local_53c < 0x65) {
        local_3d8._0_8_ = local_550;
        poVar2 = (ostringstream *)(local_3d8 + 8);
        std::__cxx11::ostringstream::ostringstream(poVar2);
        std::operator<<((ostream *)poVar2,"Failed");
        std::operator<<((ostream *)poVar2," sample:\n");
        std::operator<<((ostream *)poVar2,"\t");
        std::__cxx11::string::string
                  ((string *)local_1a8,
                   (string *)
                   &((local_548->m_variables).in0.
                     super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_2>_>_>.
                    m_ptr)->m_name);
        std::operator<<((ostream *)(local_3d8 + 8),(string *)local_1a8);
        std::operator<<((ostream *)(local_3d8 + 8)," = ");
        valueToString<tcu::Vector<float,2>>
                  ((string *)local_4e8,(shaderexecutor *)&local_458,
                   (FloatFormat *)
                   ((long)(local_258.in0.
                           super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar14),value_00);
        poVar3 = (ostream *)(local_3d8 + 8);
        std::operator<<(poVar3,(string *)local_4e8);
        std::operator<<(poVar3,"\n");
        std::__cxx11::string::~string((string *)local_4e8);
        std::__cxx11::string::~string((string *)local_1a8);
        std::operator<<(poVar3,"\t");
        std::__cxx11::string::string
                  ((string *)local_1a8,
                   (string *)
                   &((local_548->m_variables).out0.
                     super_SharedPtr<const_vkt::shaderexecutor::Variable<float>_>.m_ptr)->m_name);
        std::operator<<((ostream *)(local_3d8 + 8),(string *)local_1a8);
        std::operator<<((ostream *)(local_3d8 + 8)," = ");
        valueToString<float>
                  ((string *)local_4e8,&local_458,
                   (float *)((long)local_408.out0.super__Vector_base<float,_std::allocator<float>_>.
                                   _M_impl.super__Vector_impl_data._M_start + local_518));
        poVar3 = (ostream *)(local_3d8 + 8);
        std::operator<<(poVar3,(string *)local_4e8);
        std::operator<<(poVar3,"\n");
        std::operator<<(poVar3,"\tExpected range: ");
        intervalToString<float>(&local_4b8,&local_458,(IVal *)&local_508);
        poVar3 = (ostream *)(local_3d8 + 8);
        std::operator<<(poVar3,(string *)&local_4b8);
        std::operator<<(poVar3,"\n");
        std::__cxx11::string::~string((string *)&local_4b8);
        std::__cxx11::string::~string((string *)local_4e8);
        std::__cxx11::string::~string((string *)local_1a8);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_3d8,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar3);
      }
    }
    local_518 = local_518 + 4;
    lVar14 = lVar14 + 8;
    sVar11 = local_520;
  }
  iVar9 = (int)local_530;
  if (iVar9 < 0x65) {
    if (iVar9 == 0) {
      poVar2 = (ostringstream *)(local_3d8 + 8);
      local_3d8._0_8_ = local_550;
      std::__cxx11::ostringstream::ostringstream(poVar2);
      std::operator<<((ostream *)poVar2,"All ");
      std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      std::operator<<((ostream *)poVar2," inputs passed.");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_3d8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar2);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_3d8,"Pass",(allocator<char> *)local_1a8);
      __return_storage_ptr___00 = local_510;
      tcu::TestStatus::pass(local_510,(string *)local_3d8);
      this_02 = (string *)local_3d8;
      goto LAB_007bd5af;
    }
  }
  else {
    poVar2 = (ostringstream *)(local_3d8 + 8);
    local_3d8._0_8_ = local_550;
    std::__cxx11::ostringstream::ostringstream(poVar2);
    std::operator<<((ostream *)poVar2,"(Skipped ");
    std::ostream::operator<<(poVar2,iVar9 + -100);
    std::operator<<((ostream *)poVar2," messages.)");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_3d8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar2);
  }
  poVar2 = (ostringstream *)(local_3d8 + 8);
  local_3d8._0_8_ = local_550;
  std::__cxx11::ostringstream::ostringstream(poVar2);
  std::ostream::operator<<(poVar2,iVar9);
  std::operator<<((ostream *)poVar2,"/");
  std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::operator<<((ostream *)poVar2," inputs failed.");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_3d8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar2);
  de::toString<int>(local_1a8,(int *)&local_53c);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_4e8," test failed. Check log for the details",
             (allocator<char> *)&local_4b8);
  __return_storage_ptr___00 = local_510;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3d8,
                 local_1a8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4e8);
  tcu::TestStatus::fail(__return_storage_ptr___00,(string *)local_3d8);
  std::__cxx11::string::~string((string *)local_3d8);
  std::__cxx11::string::~string((string *)local_4e8);
  this_02 = local_1a8;
LAB_007bd5af:
  std::__cxx11::string::~string((string *)this_02);
  tcu::ResultCollector::~ResultCollector(&local_1f8);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  ::~_Rb_tree(&local_498);
  Outputs<vkt::shaderexecutor::OutTypes<float,_vkt::shaderexecutor::Void>_>::~Outputs(&local_408);
  Inputs<vkt::shaderexecutor::InTypes<tcu::Vector<float,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  ::~Inputs(&local_258);
  return __return_storage_ptr___00;
}

Assistant:

tcu::TestStatus BuiltinPrecisionCaseTestInstance<In, Out>::iterate (void)
{
	typedef typename	In::In0		In0;
	typedef typename	In::In1		In1;
	typedef typename	In::In2		In2;
	typedef typename	In::In3		In3;
	typedef typename	Out::Out0	Out0;
	typedef typename	Out::Out1	Out1;

	Inputs<In>			inputs		= generateInputs(m_samplings, m_caseCtx.floatFormat, m_caseCtx.precision, m_caseCtx.numRandoms, 0xdeadbeefu + m_caseCtx.testContext.getCommandLine().getBaseSeed());
	const FloatFormat&	fmt			= m_caseCtx.floatFormat;
	const int			inCount		= numInputs<In>();
	const int			outCount	= numOutputs<Out>();
	const size_t		numValues	= (inCount > 0) ? inputs.in0.size() : 1;
	Outputs<Out>		outputs		(numValues);
	const FloatFormat	highpFmt	= m_caseCtx.highpFormat;
	const int			maxMsgs		= 100;
	int					numErrors	= 0;
	Environment			env;		// Hoisted out of the inner loop for optimization.
	ResultCollector		status;
	TestLog&			testLog		= m_context.getTestContext().getLog();

	const void*			inputArr[]	=
	{
		&inputs.in0.front(), &inputs.in1.front(), &inputs.in2.front(), &inputs.in3.front(),
	};
	void*				outputArr[]	=
	{
		&outputs.out0.front(), &outputs.out1.front(),
	};

	// Print out the statement and its definitions
	testLog << TestLog::Message << "Statement: " << m_stmt << TestLog::EndMessage;
	{
		ostringstream	oss;
		FuncSet			funcs;

		m_stmt->getUsedFuncs(funcs);
		for (FuncSet::const_iterator it = funcs.begin(); it != funcs.end(); ++it)
		{
			(*it)->printDefinition(oss);
		}
		if (!funcs.empty())
			testLog << TestLog::Message << "Reference definitions:\n" << oss.str()
				  << TestLog::EndMessage;
	}

	switch (inCount)
	{
		case 4: DE_ASSERT(inputs.in3.size() == numValues);
		case 3: DE_ASSERT(inputs.in2.size() == numValues);
		case 2: DE_ASSERT(inputs.in1.size() == numValues);
		case 1: DE_ASSERT(inputs.in0.size() == numValues);
		default: break;
	}

	m_executor->execute(int(numValues), inputArr, outputArr);

	// Initialize environment with dummy values so we don't need to bind in inner loop.
	{
		const typename Traits<In0>::IVal		in0;
		const typename Traits<In1>::IVal		in1;
		const typename Traits<In2>::IVal		in2;
		const typename Traits<In3>::IVal		in3;
		const typename Traits<Out0>::IVal		reference0;
		const typename Traits<Out1>::IVal		reference1;

		env.bind(*m_variables.in0, in0);
		env.bind(*m_variables.in1, in1);
		env.bind(*m_variables.in2, in2);
		env.bind(*m_variables.in3, in3);
		env.bind(*m_variables.out0, reference0);
		env.bind(*m_variables.out1, reference1);
	}

	// For each input tuple, compute output reference interval and compare
	// shader output to the reference.
	for (size_t valueNdx = 0; valueNdx < numValues; valueNdx++)
	{
		bool						result		= true;
		typename Traits<Out0>::IVal	reference0;
		typename Traits<Out1>::IVal	reference1;

		env.lookup(*m_variables.in0) = convert<In0>(fmt, round(fmt, inputs.in0[valueNdx]));
		env.lookup(*m_variables.in1) = convert<In1>(fmt, round(fmt, inputs.in1[valueNdx]));
		env.lookup(*m_variables.in2) = convert<In2>(fmt, round(fmt, inputs.in2[valueNdx]));
		env.lookup(*m_variables.in3) = convert<In3>(fmt, round(fmt, inputs.in3[valueNdx]));

		{
			EvalContext	ctx (fmt, m_caseCtx.precision, env);
			m_stmt->execute(ctx);
		}

		switch (outCount)
		{
			case 2:
				reference1 = convert<Out1>(highpFmt, env.lookup(*m_variables.out1));
				if (!status.check(contains(reference1, outputs.out1[valueNdx]),
									"Shader output 1 is outside acceptable range"))
					result = false;
			case 1:
				reference0 = convert<Out0>(highpFmt, env.lookup(*m_variables.out0));
				if (!status.check(contains(reference0, outputs.out0[valueNdx]),
									"Shader output 0 is outside acceptable range"))
					result = false;
			default: break;
		}

		if (!result)
			++numErrors;

		if ((!result && numErrors <= maxMsgs) || GLS_LOG_ALL_RESULTS)
		{
			MessageBuilder	builder	= testLog.message();

			builder << (result ? "Passed" : "Failed") << " sample:\n";

			if (inCount > 0)
			{
				builder << "\t" << m_variables.in0->getName() << " = "
						<< valueToString(highpFmt, inputs.in0[valueNdx]) << "\n";
			}

			if (inCount > 1)
			{
				builder << "\t" << m_variables.in1->getName() << " = "
						<< valueToString(highpFmt, inputs.in1[valueNdx]) << "\n";
			}

			if (inCount > 2)
			{
				builder << "\t" << m_variables.in2->getName() << " = "
						<< valueToString(highpFmt, inputs.in2[valueNdx]) << "\n";
			}

			if (inCount > 3)
			{
				builder << "\t" << m_variables.in3->getName() << " = "
						<< valueToString(highpFmt, inputs.in3[valueNdx]) << "\n";
			}

			if (outCount > 0)
			{
				builder << "\t" << m_variables.out0->getName() << " = "
						<< valueToString(highpFmt, outputs.out0[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out0>(highpFmt, reference0) << "\n";
			}

			if (outCount > 1)
			{
				builder << "\t" << m_variables.out1->getName() << " = "
						<< valueToString(highpFmt, outputs.out1[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out1>(highpFmt, reference1) << "\n";
			}

			builder << TestLog::EndMessage;
		}
	}

	if (numErrors > maxMsgs)
	{
		testLog << TestLog::Message << "(Skipped " << (numErrors - maxMsgs) << " messages.)"
			  << TestLog::EndMessage;
	}

	if (numErrors == 0)
	{
		testLog << TestLog::Message << "All " << numValues << " inputs passed."
			  << TestLog::EndMessage;
	}
	else
	{
		testLog << TestLog::Message << numErrors << "/" << numValues << " inputs failed."
			  << TestLog::EndMessage;
	}

	if (numErrors)
		return tcu::TestStatus::fail(de::toString(numErrors) + string(" test failed. Check log for the details"));
	else
		return tcu::TestStatus::pass("Pass");

}